

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O1

void count_suite::count_full(void)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  initializer_list<int> input;
  basic_iterator<int> __first;
  basic_iterator<int> __first_00;
  basic_iterator<int> __last;
  basic_iterator<int> __last_00;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  undefined4 local_90;
  undefined4 local_8c;
  difference_type local_88 [2];
  undefined4 local_78;
  circular_view<int,_18446744073709551615UL> local_68;
  type local_48 [6];
  
  local_68.member.data = local_48;
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  local_68.member.cap = 4;
  local_68.member.size = 0;
  local_68.member.next = 4;
  local_88[0] = 0x160000000b;
  local_88[1] = 0x2c00000021;
  local_78 = 0x37;
  input._M_len = 5;
  input._M_array = (iterator)local_88;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_68,input);
  uVar1 = local_68.member.cap * 2;
  uVar2 = uVar1 - (local_68.member.cap & 0x5555555555555555);
  uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
  uVar2 = ((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar2 >> 0x38 < 2) {
    uVar3 = uVar1 - 1 & local_68.member.next - local_68.member.size;
  }
  else {
    uVar3 = (local_68.member.next - local_68.member.size) % uVar1;
  }
  if ((byte)(uVar2 >> 0x38) < 2) {
    uVar1 = uVar1 - 1 & local_68.member.next;
  }
  else {
    uVar1 = local_68.member.next % uVar1;
  }
  local_8c = 0xb;
  __first.current = uVar3;
  __first.parent = &local_68;
  __last.current = uVar1;
  __last.parent = &local_68;
  local_88[0] = std::
                __count_if<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                          (__first,__last,(_Iter_equals_val<const_int>)&local_8c);
  local_90 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count(span.begin(), span.end(), 11)","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0xe8,"void count_suite::count_full()",local_88,&local_90);
  uVar1 = local_68.member.cap * 2;
  uVar2 = uVar1 - (local_68.member.cap & 0x5555555555555555);
  uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
  uVar2 = ((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar2 >> 0x38 < 2) {
    uVar3 = uVar1 - 1 & local_68.member.next - local_68.member.size;
  }
  else {
    uVar3 = (local_68.member.next - local_68.member.size) % uVar1;
  }
  if ((byte)(uVar2 >> 0x38) < 2) {
    uVar1 = uVar1 - 1 & local_68.member.next;
  }
  else {
    uVar1 = local_68.member.next % uVar1;
  }
  local_8c = 0x16;
  __first_00.current = uVar3;
  __first_00.parent = &local_68;
  __last_00.current = uVar1;
  __last_00.parent = &local_68;
  local_88[0] = std::
                __count_if<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                          (__first_00,__last_00,(_Iter_equals_val<const_int>)&local_8c);
  local_90 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count(span.begin(), span.end(), 22)","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0xe9,"void count_suite::count_full()",local_88,&local_90);
  return;
}

Assistant:

void count_full()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44, 55 };
    BOOST_TEST_EQ(std::count(span.begin(), span.end(), 11), 0);
    BOOST_TEST_EQ(std::count(span.begin(), span.end(), 22), 1);
}